

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_scalar_fe_space.h
# Opt level: O0

DofHandler * __thiscall
lf::fe::HierarchicScalarFESpace<double>::LocGlobMap(HierarchicScalarFESpace<double> *this)

{
  bool bVar1;
  runtime_error *this_00;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  shared_ptr<const_lf::mesh::Mesh> local_20;
  HierarchicScalarFESpace<double> *local_10;
  HierarchicScalarFESpace<double> *this_local;
  
  local_10 = this;
  (**(this->super_ScalarFESpace<double>)._vptr_ScalarFESpace)(&local_20);
  bVar1 = std::operator==(&local_20,(nullptr_t)0x0);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_20);
  if (!bVar1) {
    return &(this->dofh_).super_DofHandler;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"No valid FE space object: no mesh");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"Mesh() != nullptr",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_scalar_fe_space.h"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0x82,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] const lf::assemble::DofHandler &LocGlobMap() const override {
    LF_VERIFY_MSG(Mesh() != nullptr, "No valid FE space object: no mesh");
    return dofh_;
  }